

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.cpp
# Opt level: O3

bool __thiscall sjtu::TrainManager::buy_ticket(TrainManager *this,orderType *order)

{
  char (*pacVar1) [41];
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  long *plVar2;
  stationType *psVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  undefined4 extraout_var;
  long lVar8;
  orderstatus oVar9;
  uint uVar10;
  char *__s;
  ulong uVar11;
  long lVar12;
  trainType *ptVar13;
  bool bVar14;
  bool bVar15;
  pair<long,_bool> pVar16;
  timeType local_128;
  long local_118 [2];
  long *local_108;
  size_t local_100;
  long local_f8 [2];
  int local_e4;
  orderType *local_e0;
  long *local_d8;
  size_t sStack_d0;
  stationType *local_c8;
  int *local_c0;
  ulong local_b8;
  ulong local_b0;
  trainType *local_a8;
  char (*local_a0) [41];
  timeType *local_98;
  char (*local_90) [41];
  TrainManager *local_88;
  long *local_80;
  long local_78;
  long local_70 [2];
  long local_60;
  char local_58;
  string local_50;
  trainType *ptVar7;
  
  this_00 = this->TrainBpTree;
  local_80 = local_70;
  sVar6 = strlen(order->trainID);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,order->trainID,order->trainID + sVar6);
  if (local_78 == 0) {
    local_128._0_8_ = (long *)0x0;
  }
  else {
    lVar12 = 0;
    lVar8 = 0;
    uVar11 = 0;
    do {
      lVar8 = ((long)*(char *)((long)local_80 + lVar12) + lVar8 * 0x239 + 0x100) % 0x3b800001;
      uVar11 = (long)((long)*(char *)((long)local_80 + lVar12) + uVar11 * 0x301 + 0x100) %
               0x3b9aca07;
      lVar12 = lVar12 + 1;
    } while (local_78 != lVar12);
    local_128._0_8_ = lVar8 << 0x20 | uVar11;
  }
  pVar16 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (this_00,(unsigned_long_long *)&local_128);
  local_58 = pVar16.second;
  local_60 = pVar16.first;
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_58 != '\0') {
    local_88 = this;
    iVar4 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[2])
                      (this->TrainFile,&local_60);
    ptVar7 = (trainType *)CONCAT44(extraout_var,iVar4);
    local_e4 = order->num;
    local_98 = order->date;
    iVar4 = timeType::dateminus(local_98,ptVar7->saleDate);
    pacVar1 = order->station;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar6 = strlen(*pacVar1);
    local_e0 = order;
    local_90 = pacVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,pacVar1,order->station[0] + sVar6);
    local_a8 = ptVar7;
    iVar5 = trainType::get_Delta_date(ptVar7,&local_50);
    uVar10 = iVar5 + iVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    ptVar13 = local_a8;
    if ((((-1 < (int)uVar10) &&
         (iVar4 = timeType::dateminus(local_a8->saleDate + 1,ptVar7->saleDate), (int)uVar10 <= iVar4
         )) && (ptVar13->is_released != false)) && (local_e0->num <= ptVar13->seatNum)) {
      sStack_d0._0_4_ = (ptVar13->startTime).hour;
      sStack_d0._4_4_ = (ptVar13->startTime).minute;
      local_d8 = *(long **)local_98;
      if (ptVar13->stationNum < 1) {
        return false;
      }
      local_b8 = 0;
      local_c8 = ptVar13->stations;
      local_a0 = local_e0->station + 1;
      local_c0 = ptVar13->stations[0].seatNum + uVar10;
      lVar8 = 0;
      lVar12 = 0;
      local_b0 = 0;
      do {
        if (lVar8 != 0) {
          timeType::operator+(&local_128,(int *)&local_d8);
          local_d8 = (long *)local_128._0_8_;
          sStack_d0._0_4_ = local_128.hour;
          sStack_d0._4_4_ = local_128.minute;
        }
        if ((local_b0 & 1) != 0) {
          local_b8 = (ulong)(uint)((int)local_b8 +
                                  *(int *)((long)&ptVar13->stations[0].price + lVar8));
          if (*(int *)((long)local_c0 + lVar8) <= local_e4) {
            local_e4 = *(int *)((long)local_c0 + lVar8);
          }
        }
        __s = ptVar13->stations[0].stationName + lVar8;
        local_128._0_8_ = local_118;
        sVar6 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,__s,ptVar13->stations[0].stationName + sVar6 + lVar8);
        pacVar1 = local_a0;
        local_108 = local_f8;
        sVar6 = strlen(*local_a0);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,pacVar1,*pacVar1 + sVar6);
        plVar2 = local_108;
        if (local_128._8_8_ == local_100) {
          if (local_128._8_8_ == 0) {
            bVar14 = true;
          }
          else {
            iVar4 = bcmp((void *)local_128._0_8_,local_108,local_128._8_8_);
            bVar14 = iVar4 == 0;
          }
        }
        else {
          bVar14 = false;
        }
        if (plVar2 != local_f8) {
          operator_delete(plVar2,local_f8[0] + 1);
        }
        if ((long *)local_128._0_8_ != local_118) {
          operator_delete((void *)local_128._0_8_,local_118[0] + 1);
        }
        ptVar7 = local_a8;
        if (bVar14) {
          *(long **)(local_e0->date + 1) = local_d8;
          local_e0->date[1].hour = (undefined4)sStack_d0;
          local_e0->date[1].minute = sStack_d0._4_4_;
          local_e0->price = (int)local_b8;
          if ((local_b0 & 1) == 0) {
            return false;
          }
          oVar9 = pending;
          if (local_e4 != local_e0->num) goto LAB_0011b942;
          if (local_a8->stationNum < 1) {
            oVar9 = success;
            goto LAB_0011b942;
          }
          lVar8 = 0;
          bVar14 = false;
          goto LAB_0011b756;
        }
        if (lVar8 != 0) {
          timeType::operator+(&local_128,(int *)&local_d8);
          local_d8 = (long *)local_128._0_8_;
          sStack_d0._0_4_ = local_128.hour;
          sStack_d0._4_4_ = local_128.minute;
        }
        local_128._0_8_ = local_118;
        sVar6 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,__s,ptVar7->stations[0].stationName + sVar6 + lVar8);
        pacVar1 = local_90;
        local_108 = local_f8;
        sVar6 = strlen(*local_90);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,pacVar1,*pacVar1 + sVar6);
        plVar2 = local_108;
        if (local_128._8_8_ == local_100) {
          if (local_128._8_8_ == 0) {
            bVar14 = true;
          }
          else {
            iVar4 = bcmp((void *)local_128._0_8_,local_108,local_128._8_8_);
            bVar14 = iVar4 == 0;
          }
        }
        else {
          bVar14 = false;
        }
        if (plVar2 != local_f8) {
          operator_delete(plVar2,local_f8[0] + 1);
        }
        if ((long *)local_128._0_8_ != local_118) {
          operator_delete((void *)local_128._0_8_,local_118[0] + 1);
        }
        if (bVar14) {
          local_d8 = *(long **)local_98;
          *(long **)local_98 = local_d8;
          local_98->hour = (undefined4)sStack_d0;
          local_98->minute = sStack_d0._4_4_;
          local_b0 = CONCAT71((int7)(sStack_d0 >> 8),1);
        }
        lVar12 = lVar12 + 1;
        lVar8 = lVar8 + 0x1a8;
        ptVar13 = local_a8;
      } while (lVar12 < local_a8->stationNum);
    }
  }
  return false;
  while( true ) {
    local_128._0_8_ = local_118;
    sVar6 = strlen(local_c8->stationName);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,psVar3,psVar3->stationName + sVar6);
    pacVar1 = local_90;
    local_108 = local_f8;
    sVar6 = strlen(*local_90);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,pacVar1,*pacVar1 + sVar6);
    plVar2 = local_108;
    if (local_128._8_8_ == local_100) {
      if (local_128._8_8_ == 0) {
        bVar15 = true;
      }
      else {
        iVar4 = bcmp((void *)local_128._0_8_,local_108,local_128._8_8_);
        bVar15 = iVar4 == 0;
      }
    }
    else {
      bVar15 = false;
    }
    if (plVar2 != local_f8) {
      operator_delete(plVar2,local_f8[0] + 1);
    }
    if ((long *)local_128._0_8_ != local_118) {
      operator_delete((void *)local_128._0_8_,local_118[0] + 1);
    }
    bVar14 = (bool)(bVar14 | bVar15);
    lVar8 = lVar8 + 1;
    local_c0 = local_c0 + 0x6a;
    local_c8 = local_c8 + 1;
    if (ptVar7->stationNum <= lVar8) break;
LAB_0011b756:
    psVar3 = local_c8;
    if (bVar14) {
      *local_c0 = *local_c0 - local_e0->num;
    }
    local_128._0_8_ = local_118;
    sVar6 = strlen(local_c8->stationName);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,psVar3,psVar3->stationName + sVar6);
    pacVar1 = local_a0;
    local_108 = local_f8;
    sVar6 = strlen(*local_a0);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,pacVar1,*pacVar1 + sVar6);
    plVar2 = local_108;
    if (local_128._8_8_ == local_100) {
      if (local_128._8_8_ == 0) {
        bVar15 = true;
      }
      else {
        iVar4 = bcmp((void *)local_128._0_8_,local_108,local_128._8_8_);
        bVar15 = iVar4 == 0;
      }
    }
    else {
      bVar15 = false;
    }
    if (plVar2 != local_f8) {
      operator_delete(plVar2,local_f8[0] + 1);
    }
    if ((long *)local_128._0_8_ != local_118) {
      operator_delete((void *)local_128._0_8_,local_118[0] + 1);
    }
    psVar3 = local_c8;
    oVar9 = success;
    if (bVar15) break;
  }
LAB_0011b942:
  local_e0->status = oVar9;
  (*(local_88->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[3])
            (local_88->TrainFile,&ptVar7->offset);
  return true;
}

Assistant:

bool TrainManager::buy_ticket(orderType *order)
	{
		auto ret = TrainBpTree -> find(hasher(order -> trainID));
		if (ret.second == false) return 0;
		else
		{
			trainType *train = TrainFile -> read(ret.first);
			int min_ticket_num = order -> num , day_id = timeType::dateminus(order -> date[0] , train -> saleDate[0]) + train -> get_Delta_date(std::string(order -> station[0])) , single_ticket_price = 0;
			if (day_id < 0 || day_id > timeType::dateminus(train -> saleDate[1] , train -> saleDate[0]) || train -> is_released == false || order -> num > train -> seatNum) return 0;
			else
			{
				timeType current_time = train -> startTime;
				current_time.month = order -> date[0].month , current_time.day = order -> date[0].day;
				bool flag = false , end_flag = false;
				for (int i = 0;i < train -> stationNum;++ i)
				{
					if (i) current_time = current_time + train -> stations[i].travelTime;
					if (flag) single_ticket_price += train -> stations[i].price , min_ticket_num = min(min_ticket_num , train -> stations[i].seatNum[day_id]);
					if (std::string(train -> stations[i].stationName) == std::string(order -> station[1]))
					{
						order -> date[1] = current_time , order -> price = single_ticket_price , end_flag = true;
						break;
					}
					if (i) current_time = current_time + train -> stations[i].stopoverTime;
					if (std::string(train -> stations[i].stationName) == std::string(order -> station[0]))
					{
						current_time.month = order -> date[0].month , current_time.day = order -> date[0].day;
						order -> date[0] = current_time , flag = true;
					}
				}
				if (!flag || !end_flag) return false;
				if (min_ticket_num == order -> num)
				{
					flag = false;
					for (int i = 0;i < train -> stationNum;++ i)
					{
						if (flag) train -> stations[i].seatNum[day_id] -= order -> num;
						if (std::string(train -> stations[i].stationName) == std::string(order -> station[1])) break;
						if (std::string(train -> stations[i].stationName) == std::string(order -> station[0])) flag = true;
					}
					order -> status = success;
				}
				else order -> status = pending;
				TrainFile -> save(train -> offset);
				return true;
			}
		}
	}